

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  spv_result_t sVar1;
  undefined1 local_1d8 [8];
  Parser parser;
  spv_context_t hijack_context;
  spv_parsed_instruction_fn_t parsed_instruction_local;
  spv_parsed_header_fn_t parsed_header_local;
  size_t num_words_local;
  uint32_t *code_local;
  void *user_data_local;
  spv_const_context context_local;
  
  spv_context_t::spv_context_t
            ((spv_context_t *)
             &parser._.expected_operands.
              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,context);
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer
              ((spv_context)
               &parser._.expected_operands.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,diagnostic);
  }
  anon_unknown.dwarf_21a7766::Parser::Parser
            ((Parser *)local_1d8,
             (spv_const_context)
             &parser._.expected_operands.
              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,user_data,parsed_header,parsed_instruction);
  sVar1 = anon_unknown.dwarf_21a7766::Parser::parse((Parser *)local_1d8,code,num_words,diagnostic);
  anon_unknown.dwarf_21a7766::Parser::~Parser((Parser *)local_1d8);
  spv_context_t::~spv_context_t
            ((spv_context_t *)
             &parser._.expected_operands.
              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return sVar1;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}